

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O3

void __thiscall
Diligent::DearchiverBase::UnpackPipelineStateImpl<Diligent::GraphicsPipelineStateCreateInfo>
          (DearchiverBase *this,PipelineStateUnpackInfo *UnpackInfo,IPipelineState **ppPSO)

{
  IPipelineResourceSignature *pIVar1;
  IPipelineResourceSignature *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ArchiveData *Archive;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [30];
  ulong uVar7;
  long lVar8;
  ShaderResourceVariableDesc *Var;
  ShaderResourceVariableDesc *pSVar9;
  Char **ppCVar10;
  ImmutableSamplerDesc *pIVar11;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  string _msg;
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  pSignatures;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ImmutableSamplers;
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  Variables;
  PipelineResourceLayoutDesc ResourceLayout;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Strings;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo> PSO;
  string local_310;
  PipelineResourceSignatureDesc *local_2f0;
  IPipelineState **local_2e8;
  void *local_2e0;
  long local_2d8;
  long local_2d0;
  ImmutableSamplerDesc *local_2c8;
  ImmutableSamplerDesc *local_2c0;
  long local_2b8;
  ShaderResourceVariableDesc *local_2b0;
  ShaderResourceVariableDesc *local_2a8;
  long local_2a0;
  PipelineResourceLayoutDesc local_298;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_270;
  undefined1 local_238 [32];
  IMemoryAllocator *local_218;
  GraphicsPipelineStateCreateInfo local_210;
  PSOCreateInternalInfo local_b8;
  SerializedPSOAuxData local_b4;
  char *local_b0;
  char *pcStack_a8;
  char *local_a0;
  char *pcStack_98;
  char *local_90;
  char *pcStack_88;
  char *local_80;
  char *pcStack_78;
  char *local_70;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  vStack_68;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  local_50;
  
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)local_238,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    DebugAssertionFailed
              ((Char *)local_238._0_8_,"UnpackPipelineStateImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x254);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
  }
  if ((UnpackInfo->ModifyPipelineStateCreateInfo ==
       (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) &&
     (bVar3 = NamedResourceCache<Diligent::IPipelineState>::Get
                        (&(this->m_Cache).PSO,GraphicsPipeline,UnpackInfo->Name,ppPSO), bVar3)) {
    return;
  }
  Archive = FindArchive(this,GraphicsPipeline,UnpackInfo->Name);
  if (Archive == (ArchiveData *)0x0) {
    return;
  }
  local_2e8 = ppPSO;
  local_218 = GetRawAllocator();
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = (pointer)0x0;
  local_238._16_8_ = 0;
  local_238._24_4_ = 0x800;
  GraphicsPipelineStateCreateInfo::GraphicsPipelineStateCreateInfo(&local_210);
  local_b8.Flags = PSO_CREATE_INTERNAL_FLAG_NONE;
  local_b4.NoShaderReflection = false;
  local_b0 = (char *)0x0;
  pcStack_a8 = (char *)0x0;
  local_a0 = (char *)0x0;
  pcStack_98 = (char *)0x0;
  local_90 = (char *)0x0;
  pcStack_88 = (char *)0x0;
  local_80 = (char *)0x0;
  pcStack_78 = (char *)0x0;
  local_70 = (char *)0x0;
  vStack_68.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_68.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_68.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = DeviceObjectArchive::
          LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::GraphicsPipelineStateCreateInfo>>
                    ((Archive->pObjArchive)._M_t.
                     super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                     .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                     _M_head_impl,GraphicsPipeline,UnpackInfo->Name,
                     (PSOData<Diligent::GraphicsPipelineStateCreateInfo> *)local_238);
  if (!bVar3) goto LAB_0046a837;
  iVar5 = (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0x18])();
  if (*(int *)CONCAT44(extraout_var,iVar5) - 1U < 2) {
    local_b8.Flags = local_b8.Flags & ~PSO_CREATE_INTERNAL_FLAG_LAST;
  }
  bVar3 = UnpackPSORenderPass<Diligent::GraphicsPipelineStateCreateInfo>
                    (this,(PSOData<Diligent::GraphicsPipelineStateCreateInfo> *)local_238,
                     UnpackInfo->pDevice);
  if (((!bVar3) ||
      (bVar3 = UnpackPSOSignatures<Diligent::GraphicsPipelineStateCreateInfo>
                         (this,(PSOData<Diligent::GraphicsPipelineStateCreateInfo> *)local_238,
                          UnpackInfo->pDevice), !bVar3)) ||
     (bVar3 = UnpackPSOShaders<Diligent::GraphicsPipelineStateCreateInfo>
                        (this,Archive,
                         (PSOData<Diligent::GraphicsPipelineStateCreateInfo> *)local_238,
                         UnpackInfo->pDevice), !bVar3)) goto LAB_0046a837;
  PSOData<Diligent::GraphicsPipelineStateCreateInfo>::AssignShaders
            ((PSOData<Diligent::GraphicsPipelineStateCreateInfo> *)local_238);
  local_210.super_PipelineStateCreateInfo.PSODesc.SRBAllocationGranularity =
       UnpackInfo->SRBAllocationGranularity;
  local_210.super_PipelineStateCreateInfo.PSODesc.ImmediateContextMask =
       UnpackInfo->ImmediateContextMask;
  local_210.super_PipelineStateCreateInfo.pPSOCache = UnpackInfo->pCache;
  if (UnpackInfo->ModifyPipelineStateCreateInfo !=
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    local_2f0 = (PipelineResourceSignatureDesc *)
                CONCAT71(local_2f0._1_7_,
                         local_210.super_PipelineStateCreateInfo.PSODesc.PipelineType);
    local_298.ImmutableSamplers =
         local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.ImmutableSamplers;
    local_298.Variables = local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables;
    local_298.NumImmutableSamplers =
         local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.NumImmutableSamplers;
    local_298._28_4_ = local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._28_4_;
    local_298.DefaultVariableType =
         local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.DefaultVariableType;
    local_298._1_3_ = local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._1_3_;
    local_298.DefaultVariableMergeStages =
         local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.DefaultVariableMergeStages;
    local_298.NumVariables =
         local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.NumVariables;
    local_298._12_4_ = local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._12_4_;
    local_270._M_buckets = &local_270._M_single_bucket;
    local_270._M_bucket_count = 1;
    local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_270._M_element_count = 0;
    local_270._M_rehash_policy._M_max_load_factor = 1.0;
    local_270._M_rehash_policy._M_next_resize = 0;
    local_270._M_single_bucket = (__node_base_ptr)0x0;
    std::
    vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
    ::vector<Diligent::ShaderResourceVariableDesc_const*,void>
              ((vector<Diligent::ShaderResourceVariableDesc,std::allocator<Diligent::ShaderResourceVariableDesc>>
                *)&local_2b0,
               local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables,
               local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables +
               (local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout._8_8_ & 0xffffffff),
               (allocator_type *)&local_310);
    if (local_2b0 != local_2a8) {
      pSVar9 = local_2b0;
      do {
        pVar12 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_270,pSVar9);
        pSVar9->Name = *(Char **)((long)pVar12.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pSVar9 = pSVar9 + 1;
      } while (pSVar9 != local_2a8);
    }
    std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
    vector<Diligent::ImmutableSamplerDesc_const*,void>
              ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
                *)&local_2c8,local_298.ImmutableSamplers,
               local_298.ImmutableSamplers + (local_298._24_8_ & 0xffffffff),
               (allocator_type *)&local_310);
    if (local_2c8 != local_2c0) {
      ppCVar10 = &local_2c8->SamplerOrTextureName;
      do {
        pVar12 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_270,ppCVar10);
        *ppCVar10 = *(Char **)((long)pVar12.first.
                                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     ._M_cur.
                                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              + 8);
        pIVar11 = (ImmutableSamplerDesc *)(ppCVar10 + 8);
        ppCVar10 = ppCVar10 + 9;
      } while (pIVar11 != local_2c0);
    }
    local_298.Variables = local_2b0;
    local_298.ImmutableSamplers = local_2c8;
    std::
    vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
    ::vector<Diligent::IPipelineResourceSignature**,void>
              ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                *)&local_2e0,local_210.super_PipelineStateCreateInfo.ppResourceSignatures,
               local_210.super_PipelineStateCreateInfo.ppResourceSignatures +
               local_210.super_PipelineStateCreateInfo.ResourceSignaturesCount,
               (allocator_type *)&local_310);
    (*UnpackInfo->ModifyPipelineStateCreateInfo)
              (&local_210.super_PipelineStateCreateInfo,UnpackInfo->pUserData);
    if ((PIPELINE_TYPE)local_2f0 == local_210.super_PipelineStateCreateInfo.PSODesc.PipelineType) {
      bVar3 = PipelineResourceLayoutDesc::IsEqual
                        (&local_298,&local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout,
                         false,true);
      if (!bVar3) {
        FormatString<char[84]>
                  (&local_310,
                   (char (*) [84])
                   "Only immutable sampler descriptions in the pipeline resource layout can be modified"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0046a78a;
      }
      if ((local_298._24_8_ & 0xffffffff) != 0) {
        lVar8 = 0;
        do {
          if (*(int *)((long)((local_298.ImmutableSamplers)->Desc).BorderColor + lVar8 + -0x2c) !=
              *(int *)((long)((local_210.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
                              ImmutableSamplers)->Desc).BorderColor + lVar8 + -0x2c)) {
            FormatString<char[80]>
                      (&local_310,
                       (char (*) [80])
                       "Modifying immutable sampler shader stages in the resource layout is not allowed"
                      );
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
            }
            goto LAB_0046a78a;
          }
          lVar8 = lVar8 + 0x48;
        } while ((local_298._24_8_ & 0xffffffff) * 0x48 != lVar8);
      }
      uVar6 = (ulong)local_210.super_PipelineStateCreateInfo.ResourceSignaturesCount;
      if (local_2d8 - (long)local_2e0 >> 3 != uVar6) {
        FormatString<char[58]>
                  (&local_310,
                   (char (*) [58])"Changing the number of resource signatures is not allowed");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0046a78a;
      }
      bVar3 = true;
      if (local_210.super_PipelineStateCreateInfo.ResourceSignaturesCount != 0) {
        uVar7 = 0;
        do {
          pIVar1 = *(IPipelineResourceSignature **)((long)local_2e0 + uVar7 * 8);
          pIVar2 = local_210.super_PipelineStateCreateInfo.ppResourceSignatures[uVar7];
          if (pIVar1 != pIVar2) {
            if ((pIVar1 == (IPipelineResourceSignature *)0x0) !=
                (pIVar2 == (IPipelineResourceSignature *)0x0)) {
              FormatString<char[75]>
                        (&local_310,
                         (char (*) [75])
                         "Changing non-null resource signature to null and vice versa is not allowed"
                        );
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
              }
              goto LAB_0046a78a;
            }
            if ((pIVar1 != (IPipelineResourceSignature *)0x0) &&
               (pIVar2 != (IPipelineResourceSignature *)0x0)) {
              iVar5 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
              local_2f0 = (PipelineResourceSignatureDesc *)CONCAT44(extraout_var_00,iVar5);
              iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
              bVar4 = PipelineResourceSignaturesCompatible
                                (local_2f0,
                                 (PipelineResourceSignatureDesc *)CONCAT44(extraout_var_01,iVar5),
                                 true);
              if (!bVar4) {
                FormatString<char[134]>
                          (&local_310,
                           (char (*) [134])
                           "When changing pipeline resource signatures, only immutable sampler descriptions in new signatures are allowed to differ from original"
                          );
                if (DebugMessageCallback != (undefined *)0x0) {
                  (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
                }
                goto LAB_0046a78a;
              }
              uVar6 = (ulong)local_210.super_PipelineStateCreateInfo.ResourceSignaturesCount;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar6);
      }
    }
    else {
      FormatString<char[39]>(&local_310,(char (*) [39])"Modifying pipeline type is not allowed");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_310._M_dataplus._M_p,0,0,0);
      }
LAB_0046a78a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    if (local_2e0 != (void *)0x0) {
      operator_delete(local_2e0,local_2d0 - (long)local_2e0);
    }
    if (local_2c8 != (ImmutableSamplerDesc *)0x0) {
      operator_delete(local_2c8,local_2b8 - (long)local_2c8);
    }
    if (local_2b0 != (ShaderResourceVariableDesc *)0x0) {
      operator_delete(local_2b0,local_2a0 - (long)local_2b0);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_270);
    if (!bVar3) goto LAB_0046a837;
  }
  (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[9])(UnpackInfo->pDevice,&local_210,local_2e8)
  ;
  if (UnpackInfo->ModifyPipelineStateCreateInfo ==
      (_func_void_PipelineStateCreateInfo_ptr_void_ptr *)0x0) {
    NamedResourceCache<Diligent::IPipelineState>::Set
              (&(this->m_Cache).PSO,GraphicsPipeline,UnpackInfo->Name,*local_2e8);
  }
LAB_0046a837:
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ::~vector(&local_50);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::~vector(&vStack_68);
  DynamicLinearAllocator::~DynamicLinearAllocator((DynamicLinearAllocator *)local_238);
  return;
}

Assistant:

void DearchiverBase::UnpackPipelineStateImpl(const PipelineStateUnpackInfo& UnpackInfo,
                                             IPipelineState**               ppPSO)
{
    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);

    constexpr auto ResType = PSOData<CreateInfoType>::ArchiveResType;

    // Do not cache modified PSOs
    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
    {
        // Since PSO names must be unique (for each PSO type), we use a single cache for all
        // loaded archives.
        if (m_Cache.PSO.Get(ResType, UnpackInfo.Name, ppPSO))
            return;
    }

    // Find the archive that contains this PSO
    ArchiveData* pArchiveData = FindArchive(ResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    PSOData<CreateInfoType> PSO{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(ResType, UnpackInfo.Name, PSO))
        return;

#ifdef DILIGENT_DEVELOPMENT
    if (UnpackInfo.pDevice->GetDeviceInfo().IsD3DDevice())
    {
        // We always have reflection information in Direct3D shaders, so always
        // load it in development build to allow the engine verify bindings.
        PSO.InternalCI.Flags &= ~PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION;
    }
#endif

    if (!UnpackPSORenderPass(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOSignatures(PSO, UnpackInfo.pDevice))
        return;

    if (!UnpackPSOShaders(*pArchiveData, PSO, UnpackInfo.pDevice))
        return;

    PSO.AssignShaders();

    PSO.CreateInfo.PSODesc.SRBAllocationGranularity = UnpackInfo.SRBAllocationGranularity;
    PSO.CreateInfo.PSODesc.ImmediateContextMask     = UnpackInfo.ImmediateContextMask;
    PSO.CreateInfo.pPSOCache                        = UnpackInfo.pCache;

    if (!ModifyPipelineStateCreateInfo(PSO.CreateInfo, UnpackInfo))
        return;

    PSO.CreatePipeline(UnpackInfo.pDevice, ppPSO);

    if (UnpackInfo.ModifyPipelineStateCreateInfo == nullptr)
        m_Cache.PSO.Set(ResType, UnpackInfo.Name, *ppPSO);
}